

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::setDrawPlane(SlicePlane *this,bool newVal)

{
  PersistentValue<bool>::set(&this->drawPlane,newVal);
  requestRedraw();
  return;
}

Assistant:

void SlicePlane::setDrawPlane(bool newVal) {
  drawPlane = newVal;
  polyscope::requestRedraw();
}